

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

int dedotdotify(char *input,size_t clen,char **outp)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  _Bool dotdot;
  char *out;
  char *endp;
  char *outptr;
  char **outp_local;
  size_t clen_local;
  char *input_local;
  
  *outp = (char *)0x0;
  if ((clen < 2) || (pvVar2 = memchr(input,0x2e,clen), pvVar2 == (void *)0x0)) {
    return 0;
  }
  pcVar3 = (char *)(*Curl_cmalloc)(clen + 1);
  if (pcVar3 == (char *)0x0) {
    return 1;
  }
  *pcVar3 = '\0';
  endp = pcVar3;
  clen_local = (size_t)input;
  do {
    bVar6 = true;
    if (*(char *)clen_local == '.') {
      iVar1 = strncmp("./",(char *)clen_local,2);
      if (iVar1 == 0) {
        clen_local = clen_local + 2;
      }
      else {
        iVar1 = strncmp("../",(char *)clen_local,3);
        if (iVar1 == 0) {
          clen_local = clen_local + 3;
        }
        else {
          iVar1 = strcmp(".",(char *)clen_local);
          if ((((iVar1 == 0) || (iVar1 = strcmp("..",(char *)clen_local), iVar1 == 0)) ||
              (iVar1 = strncmp(".?",(char *)clen_local,2), iVar1 == 0)) ||
             (iVar1 = strncmp("..?",(char *)clen_local,3), iVar1 == 0)) {
            *pcVar3 = '\0';
            break;
          }
          bVar6 = false;
        }
      }
    }
    else if (*(char *)clen_local == '/') {
      iVar1 = strncmp("/./",(char *)clen_local,3);
      if (iVar1 == 0) {
        clen_local = clen_local + 2;
      }
      else {
        iVar1 = strcmp("/.",(char *)clen_local);
        if ((iVar1 == 0) || (iVar1 = strncmp("/.?",(char *)clen_local,3), iVar1 == 0)) {
          *endp = '/';
          endp[1] = '\0';
          break;
        }
        iVar1 = strncmp("/../",(char *)clen_local,4);
        if (iVar1 == 0) {
          clen_local = clen_local + 3;
          do {
            if (endp <= pcVar3) break;
            endp = endp + -1;
          } while (*endp != '/');
          *endp = '\0';
        }
        else {
          iVar1 = strcmp("/..",(char *)clen_local);
          if ((iVar1 == 0) || (iVar1 = strncmp("/..?",(char *)clen_local,4), iVar1 == 0))
          goto LAB_001a738c;
          bVar6 = false;
        }
      }
    }
    else {
      bVar6 = false;
    }
    if (!bVar6) {
      do {
        pcVar4 = (char *)(clen_local + 1);
        pcVar5 = endp + 1;
        *endp = *(char *)clen_local;
        bVar6 = false;
        if ((*pcVar4 != '\0') && (bVar6 = false, *pcVar4 != '/')) {
          bVar6 = *pcVar4 != '?';
        }
        endp = pcVar5;
        clen_local = (size_t)pcVar4;
      } while (bVar6);
      *pcVar5 = '\0';
    }
  } while (clen_local < input + clen);
  goto LAB_001a7468;
  while (endp = endp + -1, *endp != '/') {
LAB_001a738c:
    if (endp <= pcVar3) break;
  }
  *endp = '/';
  endp[1] = '\0';
LAB_001a7468:
  *outp = pcVar3;
  return 0;
}

Assistant:

UNITTEST int dedotdotify(const char *input, size_t clen, char **outp)
{
  char *outptr;
  const char *endp = &input[clen];
  char *out;

  *outp = NULL;
  /* the path always starts with a slash, and a slash has not dot */
  if((clen < 2) || !memchr(input, '.', clen))
    return 0;

  out = malloc(clen + 1);
  if(!out)
    return 1; /* out of memory */

  *out = 0; /* null-terminates, for inputs like "./" */
  outptr = out;

  do {
    bool dotdot = TRUE;
    if(*input == '.') {
      /*  A. If the input buffer begins with a prefix of "../" or "./", then
          remove that prefix from the input buffer; otherwise, */

      if(!strncmp("./", input, 2)) {
        input += 2;
        clen -= 2;
      }
      else if(!strncmp("../", input, 3)) {
        input += 3;
        clen -= 3;
      }
      /*  D. if the input buffer consists only of "." or "..", then remove
          that from the input buffer; otherwise, */

      else if(!strcmp(".", input) || !strcmp("..", input) ||
              !strncmp(".?", input, 2) || !strncmp("..?", input, 3)) {
        *out = 0;
        break;
      }
      else
        dotdot = FALSE;
    }
    else if(*input == '/') {
      /*  B. if the input buffer begins with a prefix of "/./" or "/.", where
          "."  is a complete path segment, then replace that prefix with "/" in
          the input buffer; otherwise, */
      if(!strncmp("/./", input, 3)) {
        input += 2;
        clen -= 2;
      }
      else if(!strcmp("/.", input) || !strncmp("/.?", input, 3)) {
        *outptr++ = '/';
        *outptr = 0;
        break;
      }

      /*  C. if the input buffer begins with a prefix of "/../" or "/..",
          where ".." is a complete path segment, then replace that prefix with
          "/" in the input buffer and remove the last segment and its
          preceding "/" (if any) from the output buffer; otherwise, */

      else if(!strncmp("/../", input, 4)) {
        input += 3;
        clen -= 3;
        /* remove the last segment from the output buffer */
        while(outptr > out) {
          outptr--;
          if(*outptr == '/')
            break;
        }
        *outptr = 0; /* null-terminate where it stops */
      }
      else if(!strcmp("/..", input) || !strncmp("/..?", input, 4)) {
        /* remove the last segment from the output buffer */
        while(outptr > out) {
          outptr--;
          if(*outptr == '/')
            break;
        }
        *outptr++ = '/';
        *outptr = 0; /* null-terminate where it stops */
        break;
      }
      else
        dotdot = FALSE;
    }
    else
      dotdot = FALSE;

    if(!dotdot) {
      /*  E. move the first path segment in the input buffer to the end of
          the output buffer, including the initial "/" character (if any) and
          any subsequent characters up to, but not including, the next "/"
          character or the end of the input buffer. */

      do {
        *outptr++ = *input++;
        clen--;
      } while(*input && (*input != '/') && (*input != '?'));
      *outptr = 0;
    }

    /* continue until end of path */
  } while(input < endp);

  *outp = out;
  return 0; /* success */
}